

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall Assimp::FBX::MeshGeometry::ReadLayerElement(MeshGeometry *this,Scope *layerElement)

{
  pointer pcVar1;
  int index;
  int iVar2;
  Element *el;
  Element *el_00;
  Token *pTVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_00;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var4;
  Scope *source;
  Token *t;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar5;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar1 = local_1a0 + 0x10;
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"Type","");
  el = GetRequiredElement(layerElement,(string *)local_1a0,(Element *)0x0);
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"TypedIndex","");
  el_00 = GetRequiredElement(layerElement,(string *)local_1a0,(Element *)0x0);
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  pTVar3 = GetRequiredToken(el,0);
  ParseTokenAsString_abi_cxx11_(&local_1c0,(FBX *)pTVar3,t);
  pTVar3 = GetRequiredToken(el_00,0);
  index = ParseTokenAsInt(pTVar3);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope((this->super_Geometry).super_Object.element);
  pVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::equal_range(this_00,&local_1c0);
  _Var4 = pVar5.first._M_node;
  do {
    if (_Var4._M_node == pVar5.second._M_node._M_node) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[41]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 (char (*) [41])"failed to resolve vertex layer element: ");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", index: ",9);
      std::ostream::operator<<(local_1a0,index);
      LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
LAB_005f276d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    pTVar3 = GetRequiredToken(*(Element **)(_Var4._M_node + 2),0);
    iVar2 = ParseTokenAsInt(pTVar3);
    if (iVar2 == index) {
      source = GetRequiredScope(*(Element **)(_Var4._M_node + 2));
      ReadVertexData(this,&local_1c0,index,source);
      goto LAB_005f276d;
    }
    _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node);
  } while( true );
}

Assistant:

void MeshGeometry::ReadLayerElement(const Scope& layerElement)
{
    const Element& Type = GetRequiredElement(layerElement,"Type");
    const Element& TypedIndex = GetRequiredElement(layerElement,"TypedIndex");

    const std::string& type = ParseTokenAsString(GetRequiredToken(Type,0));
    const int typedIndex = ParseTokenAsInt(GetRequiredToken(TypedIndex,0));

    const Scope& top = GetRequiredScope(element);
    const ElementCollection candidates = top.GetCollection(type);

    for (ElementMap::const_iterator it = candidates.first; it != candidates.second; ++it) {
        const int index = ParseTokenAsInt(GetRequiredToken(*(*it).second,0));
        if(index == typedIndex) {
            ReadVertexData(type,typedIndex,GetRequiredScope(*(*it).second));
            return;
        }
    }

    FBXImporter::LogError(Formatter::format("failed to resolve vertex layer element: ")
        << type << ", index: " << typedIndex);
}